

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglPreservingSwapTests.cpp
# Opt level: O1

int __thiscall deqp::egl::PreservingSwapTests::init(PreservingSwapTests *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  int iVar2;
  deUint32 dVar3;
  int iVar4;
  TestCaseGroup *this_00;
  TestCaseGroup *this_01;
  TestCase *this_02;
  long lVar5;
  char *pcVar6;
  long lVar7;
  uint uVar8;
  long lVar9;
  int iVar10;
  bool bVar11;
  string name;
  long *local_1c8;
  long local_1b8 [2];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  iVar10 = 0;
  do {
    this_00 = (TestCaseGroup *)operator_new(0x78);
    pcVar6 = "no_preserve";
    if (iVar10 == 0) {
      pcVar6 = "preserve";
    }
    TestCaseGroup::TestCaseGroup
              (this_00,(this->super_TestCaseGroup).m_eglTestCtx,pcVar6,
               glcts::fixed_sample_locations_values + 1);
    iVar4 = 0;
    do {
      this_01 = (TestCaseGroup *)operator_new(0x78);
      pcVar6 = "no_read_before_swap";
      if (iVar4 == 1) {
        pcVar6 = "read_before_swap";
      }
      TestCaseGroup::TestCaseGroup
                (this_01,(this->super_TestCaseGroup).m_eglTestCtx,pcVar6,
                 glcts::fixed_sample_locations_values + 1);
      lVar5 = 0;
      do {
        iVar1 = (&DAT_01bde1b0)[lVar5];
        uVar8 = 0xffffffff;
        lVar9 = 0;
        do {
          if (iVar10 == 0 || lVar9 != 0) {
            iVar2 = *(int *)((long)&DAT_01bde1b0 + lVar9);
            std::__cxx11::ostringstream::ostringstream(local_1a8);
            if (iVar2 == 0 && iVar1 == 0) {
              lVar7 = 7;
              pcVar6 = "no_draw";
LAB_00e3c43d:
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar6,lVar7);
            }
            else {
              if (iVar1 == 2) {
                lVar7 = 10;
                pcVar6 = "pre_render";
LAB_00e3c3f2:
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,pcVar6,lVar7);
              }
              else if (iVar1 == 1) {
                lVar7 = 9;
                pcVar6 = "pre_clear";
                goto LAB_00e3c3f2;
              }
              if ((uVar8 | (int)lVar5 - 1U) < 2) {
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"_",1);
              }
              if (iVar2 == 2) {
                lVar7 = 0xb;
                pcVar6 = "post_render";
                goto LAB_00e3c43d;
              }
              if (iVar2 == 1) {
                lVar7 = 10;
                pcVar6 = "post_clear";
                goto LAB_00e3c43d;
              }
            }
            std::__cxx11::stringbuf::str();
            std::__cxx11::ostringstream::~ostringstream(local_1a8);
            std::ios_base::~ios_base(local_138);
            this_02 = (TestCase *)operator_new(0x1ae8);
            TestCase::TestCase(this_02,(this->super_TestCaseGroup).m_eglTestCtx,(char *)local_1c8,
                               glcts::fixed_sample_locations_values + 1);
            (this_02->super_TestCase).super_TestNode._vptr_TestNode =
                 (_func_int **)&PTR__PreservingSwapTest_021607e8;
            dVar3 = deStringHash((char *)local_1c8);
            *(deUint32 *)&this_02[1].super_TestCase.super_TestNode._vptr_TestNode = dVar3;
            *(byte *)((long)&this_02[1].super_TestCase.super_TestNode._vptr_TestNode + 4) =
                 (byte)iVar10 ^ 1;
            *(bool *)((long)&this_02[1].super_TestCase.super_TestNode._vptr_TestNode + 5) =
                 iVar4 == 1;
            *(int *)&this_02[1].super_TestCase.super_TestNode.m_testCtx = iVar1;
            *(int *)((long)&this_02[1].super_TestCase.super_TestNode.m_testCtx + 4) = iVar2;
            this_02[1].super_TestCase.super_TestNode.m_description._M_dataplus._M_p = (pointer)0x0;
            this_02[1].super_TestCase.super_TestNode.m_name._M_dataplus._M_p = (pointer)0x0;
            this_02[1].super_TestCase.super_TestNode.m_name._M_string_length = 0;
            this_02[1].super_TestCase.super_TestNode.m_name.field_2._M_allocated_capacity = 0;
            glw::Functions::Functions
                      ((Functions *)
                       &this_02[1].super_TestCase.super_TestNode.m_description._M_string_length);
            this_02[0x39].super_TestCase.super_TestNode.m_name.field_2._M_allocated_capacity = 0;
            *(undefined8 *)((long)&this_02[0x39].super_TestCase.super_TestNode.m_name.field_2 + 8) =
                 0;
            tcu::TestNode::addChild((TestNode *)this_01,(TestNode *)this_02);
            if (local_1c8 != local_1b8) {
              operator_delete(local_1c8,local_1b8[0] + 1);
            }
          }
          uVar8 = uVar8 + 1;
          lVar9 = lVar9 + 4;
        } while (lVar9 != 0xc);
        lVar5 = lVar5 + 1;
      } while (lVar5 != 3);
      tcu::TestNode::addChild((TestNode *)this_00,(TestNode *)this_01);
      bVar11 = iVar4 == 0;
      iVar4 = iVar4 + 1;
    } while (bVar11);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
    iVar4 = iVar10 + 1;
    bVar11 = iVar10 != 0;
    iVar10 = iVar4;
    if (bVar11) {
      return iVar4;
    }
  } while( true );
}

Assistant:

void PreservingSwapTests::init (void)
{
	const PreservingSwapTest::DrawType preSwapDrawTypes[] =
	{
		PreservingSwapTest::DRAWTYPE_NONE,
		PreservingSwapTest::DRAWTYPE_GLES2_CLEAR,
		PreservingSwapTest::DRAWTYPE_GLES2_RENDER
	};

	const PreservingSwapTest::DrawType postSwapDrawTypes[] =
	{
		PreservingSwapTest::DRAWTYPE_NONE,
		PreservingSwapTest::DRAWTYPE_GLES2_CLEAR,
		PreservingSwapTest::DRAWTYPE_GLES2_RENDER
	};

	for (int preserveNdx = 0; preserveNdx < 2; preserveNdx++)
	{
		const bool				preserve		= (preserveNdx == 0);
		TestCaseGroup* const	preserveGroup	= new TestCaseGroup(m_eglTestCtx, (preserve ? "preserve" : "no_preserve"), "");

		for (int readPixelsNdx = 0; readPixelsNdx < 2; readPixelsNdx++)
		{
			const bool				readPixelsBeforeSwap		= (readPixelsNdx == 1);
			TestCaseGroup* const	readPixelsBeforeSwapGroup	= new TestCaseGroup(m_eglTestCtx, (readPixelsBeforeSwap ? "read_before_swap" : "no_read_before_swap"), "");

			for (int preSwapDrawTypeNdx = 0; preSwapDrawTypeNdx < DE_LENGTH_OF_ARRAY(preSwapDrawTypes); preSwapDrawTypeNdx++)
			{
				const PreservingSwapTest::DrawType preSwapDrawType = preSwapDrawTypes[preSwapDrawTypeNdx];

				for (int postSwapDrawTypeNdx = 0; postSwapDrawTypeNdx < DE_LENGTH_OF_ARRAY(postSwapDrawTypes); postSwapDrawTypeNdx++)
				{
					const PreservingSwapTest::DrawType postSwapDrawType = postSwapDrawTypes[postSwapDrawTypeNdx];

					// If not preserving and rendering after swap, then there is nothing to verify
					if (!preserve && postSwapDrawType == PreservingSwapTest::DRAWTYPE_NONE)
						continue;

					const std::string name = generateTestName(preSwapDrawType, postSwapDrawType);

					readPixelsBeforeSwapGroup->addChild(new PreservingSwapTest(m_eglTestCtx, preserve, readPixelsBeforeSwap, preSwapDrawType, postSwapDrawType, name.c_str(), ""));
				}
			}

			preserveGroup->addChild(readPixelsBeforeSwapGroup);
		}

		addChild(preserveGroup);
	}
}